

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.c
# Opt level: O2

void sysbvm_heap_replaceWeakReferencesWithTombstones(sysbvm_heap_t *heap)

{
  uint uVar1;
  ulong uVar2;
  sysbvm_heap_t *psVar3;
  uint uVar4;
  size_t i;
  ulong uVar5;
  
  psVar3 = heap;
  while (psVar3 = (sysbvm_heap_t *)psVar3->firstMallocObject, psVar3 != (sysbvm_heap_t *)0x0) {
    uVar4 = (uint)psVar3->totalSize;
    if ((((uVar4 & 0x300) == 0x100) && (((int)psVar3 + 0x10U & 0xf) == 0)) &&
       (uVar4 = uVar4 & 3, uVar4 == heap->gcBlackColor)) {
      uVar1 = *(uint *)((long)&psVar3->totalSize + 4);
      for (uVar5 = 0; uVar1 >> 3 != uVar5; uVar5 = uVar5 + 1) {
        uVar2 = (&psVar3->totalCapacity)[uVar5];
        if (((uVar2 & 0xf) == 0 && uVar2 != 0) && ((*(uint *)(uVar2 + 8) & 3) != uVar4)) {
          (&psVar3->totalCapacity)[uVar5] = 0x4f;
        }
      }
    }
  }
  return;
}

Assistant:

void sysbvm_heap_replaceWeakReferencesWithTombstones(sysbvm_heap_t *heap)
{
    sysbvm_heap_mallocObjectHeader_t *objectHeader = heap->firstMallocObject;
    while(objectHeader)
    {
        sysbvm_object_tuple_t *object = (sysbvm_object_tuple_t*)(objectHeader + 1);
        if(sysbvm_tuple_getGCColor((sysbvm_tuple_t)object) == heap->gcBlackColor)
        {
            // Only check the slots of weak objects.
            if(sysbvm_tuple_isWeakObject((sysbvm_tuple_t)object))
            {
                size_t slotCount = object->header.objectSize / sizeof(sysbvm_tuple_t);
                sysbvm_tuple_t *slots = object->pointers;

                for(size_t i = 0; i < slotCount; ++i)
                {
                    if(sysbvm_tuple_isNonNullPointer(slots[i]) && sysbvm_tuple_getGCColor(slots[i]) != heap->gcBlackColor)
                        slots[i] = SYSBVM_TOMBSTONE_TUPLE;
                }
            }
        }

        objectHeader = objectHeader->next;
    }
}